

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::Stack
          (Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *this,size_t initialCapacity)

{
  BottomUpChildIter<Kernel::PolyNf> *pBVar1;
  ulong uVar2;
  
  this->_capacity = initialCapacity;
  if (initialCapacity == 0) {
    pBVar1 = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
  }
  else {
    uVar2 = initialCapacity * 0x24 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      pBVar1 = (BottomUpChildIter<Kernel::PolyNf> *)
               FixedSizeAllocator<8UL>::alloc
                         ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar2 < 0x11) {
      pBVar1 = (BottomUpChildIter<Kernel::PolyNf> *)
               FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar2 < 0x19) {
      pBVar1 = (BottomUpChildIter<Kernel::PolyNf> *)
               FixedSizeAllocator<24UL>::alloc
                         ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar2 < 0x21) {
      pBVar1 = (BottomUpChildIter<Kernel::PolyNf> *)
               FixedSizeAllocator<32UL>::alloc
                         ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar2 < 0x31) {
      pBVar1 = (BottomUpChildIter<Kernel::PolyNf> *)
               FixedSizeAllocator<48UL>::alloc
                         ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar2 < 0x41) {
      pBVar1 = (BottomUpChildIter<Kernel::PolyNf> *)
               FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      pBVar1 = (BottomUpChildIter<Kernel::PolyNf> *)::operator_new(uVar2,0x10);
    }
  }
  this->_stack = pBVar1;
  this->_cursor = pBVar1;
  this->_end = pBVar1 + this->_capacity;
  return;
}

Assistant:

inline
  explicit Stack (size_t initialCapacity=0)
    : _capacity(initialCapacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = nullptr;
    }
    _cursor = _stack;
    _end = _stack+_capacity;
  }